

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O3

void ftghbn_(int *A1,int *A2,int *A3,int *A4,char *A5,char *A6,char *A7,char *A8,int *A9,int *A10,
            size_t C5,size_t C6,size_t C7,size_t C8)

{
  char **ttype;
  char *pcVar1;
  char **tform;
  char **tunit;
  char *s;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  unsigned_long uVar5;
  int felem_len;
  uint celem_len;
  int felem_len_00;
  int iVar6;
  ulong uVar7;
  int nelem;
  long lVar8;
  ulong uVar9;
  long B3;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  fitsfile *local_60;
  int *local_58;
  int *local_50;
  char *local_48;
  long B9;
  long tfields;
  
  local_60 = gFitsFiles[*A1];
  uVar4 = *A2;
  lVar8 = (long)(int)uVar4;
  uVar7 = 0;
  local_58 = A4;
  ffgkyj(local_60,"TFIELDS",&tfields,(char *)0x0,A10);
  if (tfields < lVar8) {
    uVar4 = (uint)tfields;
  }
  local_70 = tfields & 0xffffffff;
  if (-1 < lVar8) {
    local_70 = (ulong)uVar4;
  }
  uVar9 = 1;
  if (1 < (int)local_70) {
    uVar9 = local_70;
  }
  uVar5 = C5;
  if (C5 < gMinStrLen) {
    uVar5 = gMinStrLen;
  }
  B3 = (long)*A3;
  uVar4 = (int)uVar5 + 1;
  sVar2 = uVar9 * 8;
  local_50 = A3;
  ttype = (char **)malloc(sVar2);
  nelem = (int)uVar9;
  pcVar1 = (char *)malloc((ulong)(uVar4 * nelem));
  *ttype = pcVar1;
  local_48 = A5;
  pcVar1 = f2cstrv2(A5,pcVar1,(int)C5,uVar4,nelem);
  do {
    ttype[uVar7] = pcVar1;
    uVar7 = uVar7 + 1;
    pcVar1 = pcVar1 + (int)uVar4;
  } while (uVar9 != uVar7);
  felem_len = (int)C6;
  iVar6 = felem_len;
  if (C6 < gMinStrLen) {
    iVar6 = (int)gMinStrLen;
  }
  celem_len = iVar6 + 1;
  local_68 = (ulong)uVar4;
  tform = (char **)malloc(sVar2);
  pcVar1 = (char *)malloc((ulong)(celem_len * nelem));
  *tform = pcVar1;
  pcVar1 = f2cstrv2(A6,pcVar1,felem_len,celem_len,nelem);
  uVar7 = 0;
  do {
    tform[uVar7] = pcVar1;
    uVar7 = uVar7 + 1;
    pcVar1 = pcVar1 + (int)celem_len;
  } while (uVar9 != uVar7);
  felem_len_00 = (int)C7;
  iVar6 = felem_len_00;
  if (C7 < gMinStrLen) {
    iVar6 = (int)gMinStrLen;
  }
  iVar6 = iVar6 + 1;
  local_78 = (ulong)celem_len;
  tunit = (char **)malloc(sVar2);
  pcVar1 = (char *)malloc((ulong)(uint)(iVar6 * nelem));
  *tunit = pcVar1;
  pcVar1 = f2cstrv2(A7,pcVar1,felem_len_00,iVar6,nelem);
  uVar7 = 0;
  do {
    tunit[uVar7] = pcVar1;
    uVar7 = uVar7 + 1;
    pcVar1 = pcVar1 + iVar6;
  } while (uVar9 != uVar7);
  sVar3 = gMinStrLen;
  if (gMinStrLen <= C8) {
    sVar3 = C8;
  }
  s = (char *)malloc(sVar3 + 1);
  s[C8] = '\0';
  pcVar1 = A8;
  memcpy(s,A8,C8);
  kill_trailing(s,(char)pcVar1);
  B9 = (long)*A9;
  ffghbn(local_60,(int)local_70,&B3,local_58,ttype,tform,tunit,s,&B9,A10);
  *local_50 = (int)B3;
  c2fstrv2(*ttype,local_48,(int)local_68,(int)C5,nelem);
  free(*ttype);
  free(ttype);
  c2fstrv2(*tform,A6,(int)local_78,felem_len,nelem);
  free(*tform);
  free(tform);
  c2fstrv2(*tunit,A7,iVar6,felem_len_00,nelem);
  free(*tunit);
  free(tunit);
  sVar2 = strlen(s);
  sVar3 = C8;
  if (sVar2 < C8) {
    sVar3 = sVar2;
  }
  memcpy(A8,s,sVar3);
  if (sVar2 <= C8 && C8 - sVar2 != 0) {
    memset(A8 + sVar2,0x20,C8 - sVar2);
  }
  free(s);
  *A9 = (int)B9;
  return;
}

Assistant:

CFextern VOID_cfF(FTGHBN,ftghbn)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FITSUNIT,INT,PLONG,PINT,PSTRINGV,PSTRINGV,PSTRINGV,PSTRING,PLONG,PINT,CF_0,CF_0,CF_0,CF_0))
{
   QCF(FITSUNIT,1)
   QCF(INT,2)
   QCF(PLONG,3)
   QCF(PINT,4)
   QCF(PSTRINGV,5)
   QCF(PSTRINGV,6)
   QCF(PSTRINGV,7)
   QCF(PSTRING,8)
   QCF(PLONG,9)
   QCF(PINT,10)

   fitsfile *fptr;
   long tfields;
   int maxdim,*status;

   fptr = TCF(ftghbn,FITSUNIT,1,0);
   status =  TCF(ftghbn,PINT,10,0);
   maxdim =  TCF(ftghbn,INT,2,0);
   ffgkyj( fptr, "TFIELDS", &tfields, 0, status );
   maxdim = (maxdim<0) ? tfields : _cfMIN(tfields,maxdim);

   ffghbn(   fptr, maxdim
             TCF(ftghbn,PLONG,3,1)
             TCF(ftghbn,PINT,4,1)
             TCF(ftghbn,PSTRINGV,5,1)
             TCF(ftghbn,PSTRINGV,6,1)
             TCF(ftghbn,PSTRINGV,7,1)
             TCF(ftghbn,PSTRING,8,1)
             TCF(ftghbn,PLONG,9,1)
             , status );

   RCF(FITSUNIT,1)
   RCF(INT,2)
   RCF(PLONG,3)
   RCF(PINT,4)
   RCF(PSTRINGV,5)
   RCF(PSTRINGV,6)
   RCF(PSTRINGV,7)
   RCF(PSTRING,8)
   RCF(PLONG,9)
   RCF(PINT,10)
}